

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O0

string * __thiscall
t_perl_generator::perl_includes_abi_cxx11_(string *__return_storage_ptr__,t_perl_generator *this)

{
  t_perl_generator *this_local;
  string *inc;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,"use 5.10.0;\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"use strict;\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"use warnings;\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"use Thrift::Exception;\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"use Thrift::MessageType;\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"use Thrift::Type;\n\n");
  return __return_storage_ptr__;
}

Assistant:

string t_perl_generator::perl_includes() {
  string inc;

  inc  = "use 5.10.0;\n";
  inc += "use strict;\n";
  inc += "use warnings;\n";
  inc += "use Thrift::Exception;\n";
  inc += "use Thrift::MessageType;\n";
  inc += "use Thrift::Type;\n\n";

  return inc;
}